

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# san.c
# Opt level: O2

void duckdb_je_san_unguard_pages_pre_destroy
               (tsdn_t *tsdn,ehooks_t *ehooks,edata_t *edata,emap_t *emap)

{
  san_unguard_pages_impl(tsdn,ehooks,edata,emap,false,true,false);
  return;
}

Assistant:

void
san_unguard_pages_pre_destroy(tsdn_t *tsdn, ehooks_t *ehooks, edata_t *edata,
    emap_t *emap) {
	emap_assert_not_mapped(tsdn, emap, edata);
	/*
	 * We don't want to touch the emap of about to be destroyed extents, as
	 * they have been unmapped upon eviction from the retained ecache. Also,
	 * we unguard the extents to the right, because retained extents only
	 * own their right guard page per san_bump_alloc's logic.
	 */
	 san_unguard_pages_impl(tsdn, ehooks, edata, emap, /* left */ false,
	    /* right */ true, /* remap */ false);
}